

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O0

void __thiscall
CUIRect::Draw4(CUIRect *this,vec4 *ColorTopLeft,vec4 *ColorTopRight,vec4 *ColorBottomLeft,
              vec4 *ColorBottomRight,float Rounding,int Corners)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  IGraphics *in_RDI;
  undefined8 in_R8;
  uint in_R9D;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float Sa3;
  float Sa2;
  float Sa1;
  float Ca3;
  float Ca2;
  float Ca1;
  float a3;
  float a2;
  float a1;
  int i;
  float r;
  CQuadItem ItemQ_8;
  CQuadItem ItemQ_7;
  CQuadItem ItemQ_6;
  CQuadItem ItemQ_5;
  CQuadItem ItemQ_4;
  CQuadItem ItemQ_3;
  CQuadItem ItemQ_2;
  CQuadItem ItemQ_1;
  CQuadItem ItemQ;
  CFreeformItem ItemF_7;
  CFreeformItem ItemF_6;
  CFreeformItem ItemF_5;
  CFreeformItem ItemF_4;
  CFreeformItem ItemF_3;
  CFreeformItem ItemF_2;
  CFreeformItem ItemF_1;
  CFreeformItem ItemF;
  vec4 *in_stack_fffffffffffffdf8;
  int local_1d0;
  CQuadItem local_198;
  CQuadItem local_188;
  CQuadItem local_178;
  CQuadItem local_168;
  CQuadItem local_158;
  CQuadItem local_148;
  CQuadItem local_138;
  CQuadItem local_128;
  CQuadItem local_118;
  CFreeformItem local_108;
  CFreeformItem local_e8;
  CFreeformItem local_c8;
  CFreeformItem local_a8;
  CFreeformItem local_88;
  CFreeformItem local_68;
  CFreeformItem local_48;
  CFreeformItem local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  IGraphics::TextureClear(in_RDI);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  for (local_1d0 = 0; local_1d0 < 8; local_1d0 = local_1d0 + 2) {
    fVar1 = (float)(local_1d0 + 1) / 5.092958;
    fVar2 = (float)(local_1d0 + 2) / 5.092958;
    fVar3 = cosf((float)local_1d0 / 5.092958);
    fVar4 = cosf(fVar1);
    fVar5 = cosf(fVar2);
    fVar6 = sinf((float)local_1d0 / 5.092958);
    fVar1 = sinf(fVar1);
    fVar2 = sinf(fVar2);
    if ((in_R9D & 1) != 0) {
      IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
      IGraphics::CFreeformItem::CFreeformItem
                (&local_28,*(float *)&(in_RDI->super_IInterface)._vptr_IInterface + in_XMM0_Da,
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) + in_XMM0_Da,
                 (1.0 - fVar3) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,(1.0 - fVar6) * in_XMM0_Da +
                  *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4),
                 (1.0 - fVar5) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,(1.0 - fVar2) * in_XMM0_Da +
                  *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4),
                 (1.0 - fVar4) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,(1.0 - fVar1) * in_XMM0_Da +
                  *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4));
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_28,1);
    }
    if ((in_R9D & 2) != 0) {
      IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
      IGraphics::CFreeformItem::CFreeformItem
                (&local_48,
                 (*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                 *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da,
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) + in_XMM0_Da,
                 fVar3 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 (1.0 - fVar6) * in_XMM0_Da +
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4),
                 fVar5 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 (1.0 - fVar2) * in_XMM0_Da +
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4),
                 fVar4 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 (1.0 - fVar1) * in_XMM0_Da +
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4));
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_48,1);
    }
    if ((in_R9D & 4) != 0) {
      IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
      IGraphics::CFreeformItem::CFreeformItem
                (&local_68,*(float *)&(in_RDI->super_IInterface)._vptr_IInterface + in_XMM0_Da,
                 (*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                 *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)) - in_XMM0_Da,
                 (1.0 - fVar3) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,fVar6 * in_XMM0_Da +
                  ((*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                   *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)) - in_XMM0_Da),
                 (1.0 - fVar5) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,fVar2 * in_XMM0_Da +
                  ((*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                   *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)) - in_XMM0_Da),
                 (1.0 - fVar4) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,fVar1 * in_XMM0_Da +
                  ((*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                   *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)) - in_XMM0_Da));
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_68,1);
    }
    if ((in_R9D & 8) != 0) {
      IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
      IGraphics::CFreeformItem::CFreeformItem
                (&local_88,
                 (*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                 *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da,
                 (*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                 *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)) - in_XMM0_Da,
                 fVar3 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 fVar6 * in_XMM0_Da +
                 ((*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                  *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)) - in_XMM0_Da),
                 fVar5 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 fVar2 * in_XMM0_Da +
                 ((*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                  *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)) - in_XMM0_Da),
                 fVar4 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 fVar1 * in_XMM0_Da +
                 ((*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                  *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)) - in_XMM0_Da));
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_88,1);
    }
    if ((in_R9D & 0x10) != 0) {
      IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
      IGraphics::CFreeformItem::CFreeformItem
                (&local_a8,*(float *)&(in_RDI->super_IInterface)._vptr_IInterface,
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4),
                 (1.0 - fVar3) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,fVar6 * in_XMM0_Da +
                  (*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) - in_XMM0_Da),
                 (1.0 - fVar5) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,fVar2 * in_XMM0_Da +
                  (*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) - in_XMM0_Da),
                 (1.0 - fVar4) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,fVar1 * in_XMM0_Da +
                  (*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) - in_XMM0_Da))
      ;
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_a8,1);
    }
    if ((in_R9D & 0x20) != 0) {
      IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
      IGraphics::CFreeformItem::CFreeformItem
                (&local_c8,
                 *(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                 *(float *)&(in_RDI->super_IInterface).m_pKernel,
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4),
                 fVar3 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 fVar6 * in_XMM0_Da +
                 (*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) - in_XMM0_Da),
                 fVar5 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 fVar2 * in_XMM0_Da +
                 (*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) - in_XMM0_Da),
                 fVar4 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 fVar1 * in_XMM0_Da +
                 (*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) - in_XMM0_Da));
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_c8,1);
    }
    if ((in_R9D & 0x40) != 0) {
      IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
      IGraphics::CFreeformItem::CFreeformItem
                (&local_e8,*(float *)&(in_RDI->super_IInterface)._vptr_IInterface,
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                 *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4),
                 (1.0 - fVar3) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,(1.0 - fVar6) * in_XMM0_Da +
                  *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                  *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4),
                 (1.0 - fVar5) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,(1.0 - fVar2) * in_XMM0_Da +
                  *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                  *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4),
                 (1.0 - fVar4) * in_XMM0_Da + *(float *)&(in_RDI->super_IInterface)._vptr_IInterface
                 ,(1.0 - fVar1) * in_XMM0_Da +
                  *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                  *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4));
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_e8,1);
    }
    if ((in_R9D & 0x80) != 0) {
      IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
      IGraphics::CFreeformItem::CFreeformItem
                (&local_108,
                 *(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                 *(float *)&(in_RDI->super_IInterface).m_pKernel,
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                 *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4),
                 fVar3 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 (1.0 - fVar6) * in_XMM0_Da +
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                 *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4),
                 fVar5 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 (1.0 - fVar2) * in_XMM0_Da +
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                 *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4),
                 fVar4 * in_XMM0_Da +
                 ((*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
                  *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da),
                 (1.0 - fVar1) * in_XMM0_Da +
                 *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
                 *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4));
      (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_108,1);
    }
  }
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])(s_pGraphics,in_RSI,in_RDX,in_RCX,in_R8);
  IGraphics::CQuadItem::CQuadItem
            (&local_118,*(float *)&(in_RDI->super_IInterface)._vptr_IInterface + in_XMM0_Da,
             *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) + in_XMM0_Da,
             -in_XMM0_Da + -in_XMM0_Da + *(float *)&(in_RDI->super_IInterface).m_pKernel,
             -in_XMM0_Da + -in_XMM0_Da + *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)
            );
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_118,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])(s_pGraphics,in_RSI,in_RDX,in_RSI,in_RDX)
  ;
  IGraphics::CQuadItem::CQuadItem
            (&local_128,*(float *)&(in_RDI->super_IInterface)._vptr_IInterface + in_XMM0_Da,
             *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4),
             -in_XMM0_Da + -in_XMM0_Da + *(float *)&(in_RDI->super_IInterface).m_pKernel,in_XMM0_Da)
  ;
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_128,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])(s_pGraphics,in_RCX,in_R8,in_RCX,in_R8);
  IGraphics::CQuadItem::CQuadItem
            (&local_138,*(float *)&(in_RDI->super_IInterface)._vptr_IInterface + in_XMM0_Da,
             (*(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
             *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)) - in_XMM0_Da,
             -in_XMM0_Da + -in_XMM0_Da + *(float *)&(in_RDI->super_IInterface).m_pKernel,in_XMM0_Da)
  ;
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_138,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])(s_pGraphics,in_RSI,in_RSI,in_RCX,in_RCX)
  ;
  IGraphics::CQuadItem::CQuadItem
            (&local_148,*(float *)&(in_RDI->super_IInterface)._vptr_IInterface,
             *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) + in_XMM0_Da,
             in_XMM0_Da,
             -in_XMM0_Da + -in_XMM0_Da + *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)
            );
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_148,1);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x22])(s_pGraphics,in_RDX,in_RDX,in_R8,in_R8);
  IGraphics::CQuadItem::CQuadItem
            (&local_158,
             (*(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
             *(float *)&(in_RDI->super_IInterface).m_pKernel) - in_XMM0_Da,
             *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) + in_XMM0_Da,
             in_XMM0_Da,
             -in_XMM0_Da + -in_XMM0_Da + *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4)
            );
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_158,1);
  if ((in_R9D & 1) == 0) {
    IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
    IGraphics::CQuadItem::CQuadItem
              (&local_168,*(float *)&(in_RDI->super_IInterface)._vptr_IInterface,
               *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4),in_XMM0_Da,
               in_XMM0_Da);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_168,1);
  }
  if ((in_R9D & 2) == 0) {
    IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
    IGraphics::CQuadItem::CQuadItem
              (&local_178,
               *(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
               *(float *)&(in_RDI->super_IInterface).m_pKernel,
               *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4),-in_XMM0_Da,
               in_XMM0_Da);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_178,1);
  }
  if ((in_R9D & 4) == 0) {
    IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
    IGraphics::CQuadItem::CQuadItem
              (&local_188,*(float *)&(in_RDI->super_IInterface)._vptr_IInterface,
               *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
               *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4),in_XMM0_Da,-in_XMM0_Da);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_188,1);
  }
  if ((in_R9D & 8) == 0) {
    IGraphics::SetColor(in_RDI,in_stack_fffffffffffffdf8);
    IGraphics::CQuadItem::CQuadItem
              (&local_198,
               *(float *)&(in_RDI->super_IInterface)._vptr_IInterface +
               *(float *)&(in_RDI->super_IInterface).m_pKernel,
               *(float *)((long)&(in_RDI->super_IInterface)._vptr_IInterface + 4) +
               *(float *)((long)&(in_RDI->super_IInterface).m_pKernel + 4),-in_XMM0_Da,-in_XMM0_Da);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_198,1);
  }
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUIRect::Draw4(const vec4 &ColorTopLeft, const vec4 &ColorTopRight, const vec4 &ColorBottomLeft, const vec4 &ColorBottomRight, float Rounding, int Corners) const
{
	s_pGraphics->TextureClear();
	s_pGraphics->QuadsBegin();

	const float r = Rounding;

	for(int i = 0; i < NUM_ROUND_CORNER_SEGMENTS; i+=2)
	{
		float a1 = i/s_CornerAnglePerSegment;
		float a2 = (i+1)/s_CornerAnglePerSegment;
		float a3 = (i+2)/s_CornerAnglePerSegment;
		float Ca1 = cosf(a1);
		float Ca2 = cosf(a2);
		float Ca3 = cosf(a3);
		float Sa1 = sinf(a1);
		float Sa2 = sinf(a2);
		float Sa3 = sinf(a3);

		if(Corners&CORNER_TL)
		{
			s_pGraphics->SetColor(ColorTopLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+r, y+r,
				x+(1-Ca1)*r, y+(1-Sa1)*r,
				x+(1-Ca3)*r, y+(1-Sa3)*r,
				x+(1-Ca2)*r, y+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_TR)
		{
			s_pGraphics->SetColor(ColorTopRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w-r, y+r,
				x+w-r+Ca1*r, y+(1-Sa1)*r,
				x+w-r+Ca3*r, y+(1-Sa3)*r,
				x+w-r+Ca2*r, y+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_BL)
		{
			s_pGraphics->SetColor(ColorBottomLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+r, y+h-r,
				x+(1-Ca1)*r, y+h-r+Sa1*r,
				x+(1-Ca3)*r, y+h-r+Sa3*r,
				x+(1-Ca2)*r, y+h-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_BR)
		{
			s_pGraphics->SetColor(ColorBottomRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w-r, y+h-r,
				x+w-r+Ca1*r, y+h-r+Sa1*r,
				x+w-r+Ca3*r, y+h-r+Sa3*r,
				x+w-r+Ca2*r, y+h-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_ITL)
		{
			s_pGraphics->SetColor(ColorTopLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x, y,
				x+(1-Ca1)*r, y-r+Sa1*r,
				x+(1-Ca3)*r, y-r+Sa3*r,
				x+(1-Ca2)*r, y-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_ITR)
		{
			s_pGraphics->SetColor(ColorTopRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w, y,
				x+w-r+Ca1*r, y-r+Sa1*r,
				x+w-r+Ca3*r, y-r+Sa3*r,
				x+w-r+Ca2*r, y-r+Sa2*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_IBL)
		{
			s_pGraphics->SetColor(ColorBottomLeft);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x, y+h,
				x+(1-Ca1)*r, y+h+(1-Sa1)*r,
				x+(1-Ca3)*r, y+h+(1-Sa3)*r,
				x+(1-Ca2)*r, y+h+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}

		if(Corners&CORNER_IBR)
		{
			s_pGraphics->SetColor(ColorBottomRight);
			IGraphics::CFreeformItem ItemF = IGraphics::CFreeformItem(
				x+w, y+h,
				x+w-r+Ca1*r, y+h+(1-Sa1)*r,
				x+w-r+Ca3*r, y+h+(1-Sa3)*r,
				x+w-r+Ca2*r, y+h+(1-Sa2)*r);
			s_pGraphics->QuadsDrawFreeform(&ItemF, 1);
		}
	}

	// center
	{
		s_pGraphics->SetColor4(ColorTopLeft, ColorTopRight, ColorBottomLeft, ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+r, y+r, w-r*2, h-r*2);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// top
	{
		s_pGraphics->SetColor4(ColorTopLeft, ColorTopRight, ColorTopLeft, ColorTopRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+r, y, w-r*2, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// bottom
	{
		s_pGraphics->SetColor4(ColorBottomLeft, ColorBottomRight, ColorBottomLeft, ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+r, y+h-r, w-r*2, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// left
	{
		s_pGraphics->SetColor4(ColorTopLeft, ColorTopLeft, ColorBottomLeft, ColorBottomLeft);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x, y+r, r, h-r*2);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	// right
	{
		s_pGraphics->SetColor4(ColorTopRight, ColorTopRight, ColorBottomRight, ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+w-r, y+r, r, h-r*2);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_TL))
	{
		s_pGraphics->SetColor(ColorTopLeft);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x, y, r, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_TR))
	{
		s_pGraphics->SetColor(ColorTopRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+w, y, -r, r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_BL))
	{
		s_pGraphics->SetColor(ColorBottomLeft);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x, y+h, r, -r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	if(!(Corners&CORNER_BR))
	{
		s_pGraphics->SetColor(ColorBottomRight);
		IGraphics::CQuadItem ItemQ = IGraphics::CQuadItem(x+w, y+h, -r, -r);
		s_pGraphics->QuadsDrawTL(&ItemQ, 1);
	}

	s_pGraphics->QuadsEnd();
}